

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

void pbrt::ForEachThread(function<void_()> *func)

{
  _Manager_type p_Var1;
  ThreadPool *this;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  this = threadPool;
  if (threadPool != (ThreadPool *)0x0) {
    local_18 = (_Manager_type)0x0;
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_10 = func->_M_invoker;
    p_Var1 = (func->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_28._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor
      ;
      local_28._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
      (func->super__Function_base)._M_manager = (_Manager_type)0x0;
      func->_M_invoker = (_Invoker_type)0x0;
      local_18 = p_Var1;
    }
    ThreadPool::ForEachThread(this,(function<void_()> *)&local_28);
    if (local_18 != (_Manager_type)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
  }
  return;
}

Assistant:

void ForEachThread(std::function<void(void)> func) {
    if (threadPool)
        threadPool->ForEachThread(std::move(func));
}